

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

void __thiscall wallet::CWallet::InitWalletFlags(CWallet *this,uint64_t flags)

{
  WalletDatabase *pWVar1;
  bool bVar2;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock36;
  unique_lock<std::recursive_mutex> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  WalletBatch local_50;
  DatabaseBatch local_40;
  undefined8 uStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_80._M_device = &(this->cs_wallet).super_recursive_mutex;
  local_80._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_80);
  if (flags >> 0x24 != 0) {
    __assert_fail("((flags & KNOWN_WALLET_FLAGS) >> 32) == (flags >> 32)",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                  ,0x6d8,"void wallet::CWallet::InitWalletFlags(uint64_t)");
  }
  if ((this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i != 0) {
    __assert_fail("m_wallet_flags == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                  ,0x6da,"void wallet::CWallet::InitWalletFlags(uint64_t)");
  }
  pWVar1 = (this->m_database)._M_t.
           super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
           .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
  if (pWVar1 == (WalletDatabase *)0x0) {
    __assert_fail("static_cast<bool>(m_database)",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                  ,0x1be,"virtual WalletDatabase &wallet::CWallet::GetDatabase() const");
  }
  (*pWVar1->_vptr_WalletDatabase[0xe])(&local_50,pWVar1,1);
  local_50.m_database = pWVar1;
  bVar2 = WalletBatch::WriteWalletFlags(&local_50,flags);
  if (local_50.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0) {
    (*(*(_func_int ***)
        local_50.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
  }
  if (bVar2) {
    bVar2 = LoadWalletFlags(this,flags);
    if (!bVar2) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                    ,0x6e0,"void wallet::CWallet::InitWalletFlags(uint64_t)");
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_80);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"InitWalletFlags","");
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_70,": writing wallet flags failed");
    local_50.m_batch._M_t.
    super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t.
    super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
    super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl =
         (__uniq_ptr_data<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>,_true,_true>
          )(pbVar3->_M_dataplus)._M_p;
    paVar4 = &pbVar3->field_2;
    if (local_50.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl ==
        (__uniq_ptr_data<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>,_true,_true>
         )paVar4) {
      local_40._vptr_DatabaseBatch = (_func_int **)paVar4->_M_allocated_capacity;
      uStack_38 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
      local_50.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl =
           (__uniq_ptr_data<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>,_true,_true>
            )(__uniq_ptr_data<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>,_true,_true>
              )&local_40;
    }
    else {
      local_40._vptr_DatabaseBatch = (_func_int **)paVar4->_M_allocated_capacity;
    }
    local_50.m_database = (WalletDatabase *)pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    std::runtime_error::runtime_error(this_00,(string *)&local_50);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::InitWalletFlags(uint64_t flags)
{
    LOCK(cs_wallet);

    // We should never be writing unknown non-tolerable wallet flags
    assert(((flags & KNOWN_WALLET_FLAGS) >> 32) == (flags >> 32));
    // This should only be used once, when creating a new wallet - so current flags are expected to be blank
    assert(m_wallet_flags == 0);

    if (!WalletBatch(GetDatabase()).WriteWalletFlags(flags)) {
        throw std::runtime_error(std::string(__func__) + ": writing wallet flags failed");
    }

    if (!LoadWalletFlags(flags)) assert(false);
}